

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_ValidateUrlJavascriptEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  int iVar21;
  char *pcVar22;
  char *pcVar23;
  TemplateDictionaryPeer peer;
  TemplateString local_318;
  TemplateDictionary dict;
  TemplateString local_288;
  TemplateString local_268;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateString local_a8;
  TemplateString local_88;
  TemplateString local_68;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString(&local_318,"TestValidateUrlJavascriptEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_318,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_28,"easy http URL");
  ctemplate::TemplateString::TemplateString(&local_48,"http://www.google.com");
  TVar1.length_ = local_28.length_;
  TVar1.ptr_ = local_28.ptr_;
  TVar1.is_immutable_ = local_28.is_immutable_;
  TVar1._17_7_ = local_28._17_7_;
  TVar1.id_ = local_28.id_;
  TVar11.length_ = local_48.length_;
  TVar11.ptr_ = local_48.ptr_;
  TVar11.is_immutable_ = local_48.is_immutable_;
  TVar11._17_7_ = local_48._17_7_;
  TVar11.id_ = local_48.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar11,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_68,"harder https URL");
  ctemplate::TemplateString::TemplateString(&local_88,"https://www.google.com/search?q=f&hl=en");
  TVar2.length_ = local_68.length_;
  TVar2.ptr_ = local_68.ptr_;
  TVar2.is_immutable_ = local_68.is_immutable_;
  TVar2._17_7_ = local_68._17_7_;
  TVar2.id_ = local_68.id_;
  TVar12.length_ = local_88.length_;
  TVar12.ptr_ = local_88.ptr_;
  TVar12.is_immutable_ = local_88.is_immutable_;
  TVar12._17_7_ = local_88._17_7_;
  TVar12.id_ = local_88.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar12,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_a8,"mangled http URL");
  ctemplate::TemplateString::TemplateString(&local_c8,"HTTP://www.google.com");
  TVar3.length_ = local_a8.length_;
  TVar3.ptr_ = local_a8.ptr_;
  TVar3.is_immutable_ = local_a8.is_immutable_;
  TVar3._17_7_ = local_a8._17_7_;
  TVar3.id_ = local_a8.id_;
  TVar13.length_ = local_c8.length_;
  TVar13.ptr_ = local_c8.ptr_;
  TVar13.is_immutable_ = local_c8.is_immutable_;
  TVar13._17_7_ = local_c8._17_7_;
  TVar13.id_ = local_c8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar13,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_e8,"easy javascript URL");
  ctemplate::TemplateString::TemplateString(&local_108,"javascript:alert(document.cookie)");
  TVar4.length_ = local_e8.length_;
  TVar4.ptr_ = local_e8.ptr_;
  TVar4.is_immutable_ = local_e8.is_immutable_;
  TVar4._17_7_ = local_e8._17_7_;
  TVar4.id_ = local_e8.id_;
  TVar14.length_ = local_108.length_;
  TVar14.ptr_ = local_108.ptr_;
  TVar14.is_immutable_ = local_108.is_immutable_;
  TVar14._17_7_ = local_108._17_7_;
  TVar14.id_ = local_108.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar14,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_128,"harder javascript URL");
  ctemplate::TemplateString::TemplateString(&local_148,"javascript:alert(10/5)");
  TVar5.length_ = local_128.length_;
  TVar5.ptr_ = local_128.ptr_;
  TVar5.is_immutable_ = local_128.is_immutable_;
  TVar5._17_7_ = local_128._17_7_;
  TVar5.id_ = local_128.id_;
  TVar15.length_ = local_148.length_;
  TVar15.ptr_ = local_148.ptr_;
  TVar15.is_immutable_ = local_148.is_immutable_;
  TVar15._17_7_ = local_148._17_7_;
  TVar15.id_ = local_148.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar15,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_168,"easy relative URL");
  ctemplate::TemplateString::TemplateString(&local_188,"foobar.html");
  TVar6.length_ = local_168.length_;
  TVar6.ptr_ = local_168.ptr_;
  TVar6.is_immutable_ = local_168.is_immutable_;
  TVar6._17_7_ = local_168._17_7_;
  TVar6.id_ = local_168.id_;
  TVar16.length_ = local_188.length_;
  TVar16.ptr_ = local_188.ptr_;
  TVar16.is_immutable_ = local_188.is_immutable_;
  TVar16._17_7_ = local_188._17_7_;
  TVar16.id_ = local_188.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar16,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1a8,"harder relative URL");
  ctemplate::TemplateString::TemplateString(&local_1c8,"/search?q=green flowers&hl=en");
  TVar7.length_ = local_1a8.length_;
  TVar7.ptr_ = local_1a8.ptr_;
  TVar7.is_immutable_ = local_1a8.is_immutable_;
  TVar7._17_7_ = local_1a8._17_7_;
  TVar7.id_ = local_1a8.id_;
  TVar17.length_ = local_1c8.length_;
  TVar17.ptr_ = local_1c8.ptr_;
  TVar17.is_immutable_ = local_1c8.is_immutable_;
  TVar17._17_7_ = local_1c8._17_7_;
  TVar17.id_ = local_1c8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar17,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_1e8,"data URL");
  ctemplate::TemplateString::TemplateString(&local_208,"data: text/html");
  TVar8.length_ = local_1e8.length_;
  TVar8.ptr_ = local_1e8.ptr_;
  TVar8.is_immutable_ = local_1e8.is_immutable_;
  TVar8._17_7_ = local_1e8._17_7_;
  TVar8.id_ = local_1e8.id_;
  TVar18.length_ = local_208.length_;
  TVar18.ptr_ = local_208.ptr_;
  TVar18.is_immutable_ = local_208.is_immutable_;
  TVar18._17_7_ = local_208._17_7_;
  TVar18.id_ = local_208.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar8,TVar18,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_228,"mangled javascript URL");
  ctemplate::TemplateString::TemplateString(&local_248,"javaSCRIPT:alert(5)");
  TVar9.length_ = local_228.length_;
  TVar9.ptr_ = local_228.ptr_;
  TVar9.is_immutable_ = local_228.is_immutable_;
  TVar9._17_7_ = local_228._17_7_;
  TVar9.id_ = local_228.id_;
  TVar19.length_ = local_248.length_;
  TVar19.ptr_ = local_248.ptr_;
  TVar19.is_immutable_ = local_248.is_immutable_;
  TVar19._17_7_ = local_248._17_7_;
  TVar19.id_ = local_248.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar9,TVar19,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_268,"harder mangled javascript URL");
  ctemplate::TemplateString::TemplateString(&local_288,"java\nSCRIPT:alert(5)");
  TVar10.length_ = local_268.length_;
  TVar10.ptr_ = local_268.ptr_;
  TVar10.is_immutable_ = local_268.is_immutable_;
  TVar10._17_7_ = local_268._17_7_;
  TVar10.id_ = local_268.id_;
  TVar20.length_ = local_288.length_;
  TVar20.ptr_ = local_288.ptr_;
  TVar20.is_immutable_ = local_288.is_immutable_;
  TVar20._17_7_ = local_288._17_7_;
  TVar20.id_ = local_288.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar10,TVar20,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_318,"easy http URL");
  pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
  iVar21 = strcmp(pcVar22,"http://www.google.com");
  if (iVar21 == 0) {
    ctemplate::TemplateString::TemplateString(&local_318,"harder https URL");
    pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
    iVar21 = strcmp(pcVar22,"https://www.google.com/search?q\\x3df\\x26hl\\x3den");
    if (iVar21 == 0) {
      ctemplate::TemplateString::TemplateString(&local_318,"mangled http URL");
      pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
      iVar21 = strcmp(pcVar22,"HTTP://www.google.com");
      if (iVar21 == 0) {
        ctemplate::TemplateString::TemplateString(&local_318,"easy javascript URL");
        pcVar22 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
        if ((*pcVar22 == '#') && (pcVar22[1] == '\0')) {
          ctemplate::TemplateString::TemplateString(&local_318,"harder javascript URL");
          pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
          pcVar22 = ctemplate::ValidateUrl::kUnsafeUrlReplacement;
          iVar21 = strcmp(pcVar23,ctemplate::ValidateUrl::kUnsafeUrlReplacement);
          if (iVar21 == 0) {
            ctemplate::TemplateString::TemplateString(&local_318,"easy relative URL");
            pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
            iVar21 = strcmp(pcVar23,"foobar.html");
            if (iVar21 == 0) {
              ctemplate::TemplateString::TemplateString(&local_318,"harder relative URL");
              pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
              iVar21 = strcmp(pcVar23,"/search?q\\x3dgreen flowers\\x26hl\\x3den");
              if (iVar21 == 0) {
                ctemplate::TemplateString::TemplateString(&local_318,"data URL");
                pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
                iVar21 = strcmp(pcVar23,pcVar22);
                if (iVar21 == 0) {
                  ctemplate::TemplateString::TemplateString(&local_318,"mangled javascript URL");
                  pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
                  iVar21 = strcmp(pcVar23,pcVar22);
                  if (iVar21 == 0) {
                    ctemplate::TemplateString::TemplateString
                              (&local_318,"harder mangled javascript URL");
                    pcVar23 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_318);
                    iVar21 = strcmp(pcVar23,pcVar22);
                    if (iVar21 == 0) {
                      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
                      return;
                    }
                    pcVar22 = 
                    "strcmp(peer.GetSectionValue(\"harder mangled javascript URL\"), ctemplate::ValidateUrl::kUnsafeUrlReplacement) == 0"
                    ;
                  }
                  else {
                    pcVar22 = 
                    "strcmp(peer.GetSectionValue(\"mangled javascript URL\"), ctemplate::ValidateUrl::kUnsafeUrlReplacement) == 0"
                    ;
                  }
                }
                else {
                  pcVar22 = 
                  "strcmp(peer.GetSectionValue(\"data URL\"), ctemplate::ValidateUrl::kUnsafeUrlReplacement) == 0"
                  ;
                }
              }
              else {
                pcVar22 = 
                "strcmp(peer.GetSectionValue(\"harder relative URL\"), \"/search?q\\\\x3dgreen flowers\\\\x26hl\\\\x3den\") == 0"
                ;
              }
            }
            else {
              pcVar22 = "strcmp(peer.GetSectionValue(\"easy relative URL\"), \"foobar.html\") == 0";
            }
          }
          else {
            pcVar22 = 
            "strcmp(peer.GetSectionValue(\"harder javascript URL\"), ctemplate::ValidateUrl::kUnsafeUrlReplacement) == 0"
            ;
          }
        }
        else {
          pcVar22 = "strcmp(peer.GetSectionValue(\"easy javascript URL\"), \"#\") == 0";
        }
      }
      else {
        pcVar22 = 
        "strcmp(peer.GetSectionValue(\"mangled http URL\"), \"HTTP://www.google.com\") == 0";
      }
    }
    else {
      pcVar22 = 
      "strcmp(peer.GetSectionValue(\"harder https URL\"), \"https://www.google.com/search?q\\\\x3df\\\\x26hl\\\\x3den\") == 0"
      ;
    }
  }
  else {
    pcVar22 = "strcmp(peer.GetSectionValue(\"easy http URL\"), \"http://www.google.com\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar22);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ValidateUrlJavascriptEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateUrlJavascriptEscape", NULL);
  dict.SetEscapedValue(
      "easy http URL", "http://www.google.com",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder https URL",
      "https://www.google.com/search?q=f&hl=en",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled http URL", "HTTP://www.google.com",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy javascript URL",
      "javascript:alert(document.cookie)",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder javascript URL",
      "javascript:alert(10/5)",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "easy relative URL",
      "foobar.html",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder relative URL",
      "/search?q=green flowers&hl=en",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "data URL",
      "data: text/html",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "mangled javascript URL",
      "javaSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);
  dict.SetEscapedValue(
      "harder mangled javascript URL",
      "java\nSCRIPT:alert(5)",
      GOOGLE_NAMESPACE::validate_url_and_javascript_escape);


  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q\\x3df\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("mangled http URL"),
               "HTTP://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"), "#");
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q\\x3dgreen flowers\\x26hl\\x3den");
  EXPECT_STREQ(peer.GetSectionValue("data URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder mangled javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeUrlReplacement);
}